

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndDisabled(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ImGuiContext *pIVar4;
  
  pIVar4 = GImGui;
  if (GImGui->DisabledStackSize < 1) {
    __assert_fail("g.DisabledStackSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1c24,"void ImGui::EndDisabled()");
  }
  GImGui->DisabledStackSize = GImGui->DisabledStackSize + -1;
  iVar1 = (pIVar4->ItemFlagsStack).Size;
  if (0 < iVar1) {
    uVar2 = pIVar4->CurrentItemFlags;
    (pIVar4->ItemFlagsStack).Size = iVar1 - 1U;
    if (iVar1 != 1) {
      uVar3 = (pIVar4->ItemFlagsStack).Data[(ulong)(iVar1 - 1U) - 1];
      pIVar4->CurrentItemFlags = uVar3;
      if (((uVar2 & 4) != 0) && ((uVar3 & 4) == 0)) {
        (pIVar4->Style).Alpha = pIVar4->DisabledAlphaBackup;
      }
      return;
    }
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                  ,0x70f,"T &ImVector<int>::back() [T = int]");
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                ,0x71b,"void ImVector<int>::pop_back() [T = int]");
}

Assistant:

void ImGui::EndDisabled()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.DisabledStackSize > 0);
    g.DisabledStackSize--;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    //PopItemFlag();
    g.ItemFlagsStack.pop_back();
    g.CurrentItemFlags = g.ItemFlagsStack.back();
    if (was_disabled && (g.CurrentItemFlags & ImGuiItemFlags_Disabled) == 0)
        g.Style.Alpha = g.DisabledAlphaBackup; //PopStyleVar();
}